

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddExtension(Tables *this,FieldDescriptor *field)

{
  bool bVar1;
  DescriptorIntPair key;
  first_type local_28;
  FieldDescriptor *local_18;
  
  local_28.first = *(Descriptor **)(field + 0x58);
  local_28.second = *(int *)(field + 0x38);
  local_18 = field;
  bVar1 = InsertIfNotPresent<std::map<std::pair<google::protobuf::Descriptor_const*,int>,google::protobuf::FieldDescriptor_const*,std::less<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>>>
                    (&this->extensions_,&local_28,&local_18);
  if (bVar1) {
    std::
    vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
    ::push_back(&this->extensions_after_checkpoint_,&local_28);
  }
  return bVar1;
}

Assistant:

bool DescriptorPool::Tables::AddExtension(const FieldDescriptor* field) {
  DescriptorIntPair key(field->containing_type(), field->number());
  if (InsertIfNotPresent(&extensions_, key, field)) {
    extensions_after_checkpoint_.push_back(key);
    return true;
  } else {
    return false;
  }
}